

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

SRes RememberBitVector(CSzData *sd,UInt32 numItems,Byte **v)

{
  uint uVar1;
  UInt32 numBytes;
  Byte **v_local;
  UInt32 numItems_local;
  CSzData *sd_local;
  SRes local_4;
  
  uVar1 = numItems + 7 >> 3;
  if (sd->Size < (ulong)uVar1) {
    local_4 = 0x10;
  }
  else {
    *v = sd->Data;
    sd->Size = sd->Size - (ulong)uVar1;
    sd->Data = sd->Data + uVar1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static SRes RememberBitVector(CSzData *sd, UInt32 numItems, const Byte **v)
{
  UInt32 numBytes = (numItems + 7) >> 3;
  if (numBytes > sd->Size)
    return SZ_ERROR_ARCHIVE;
  *v = sd->Data;
  SKIP_DATA(sd, numBytes);
  return SZ_OK;
}